

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

void clask::serve_file(response_writer *resp,request *req,string *path)

{
  pointer ppVar1;
  bool bVar2;
  iterator iVar3;
  unsigned_long __val;
  time_point<std::filesystem::__file_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tp;
  tm *__tp;
  time_t tVar4;
  time_t tVar5;
  long lVar6;
  string *this;
  pointer __lhs;
  _Put_time<char> __f;
  allocator<char> local_24aa;
  allocator<char> local_24a9;
  time_t tt;
  path fspath;
  string local_2478;
  string local_2458;
  string local_2438;
  string local_2418;
  string local_23f8;
  wstring wpath;
  stringstream date;
  basic_ostream<char,_std::char_traits<char>_> local_23a8 [376];
  ifstream is;
  byte abStack_2210 [488];
  char buf [8192];
  
  to_wstring(&wpath,path);
  buf._0_8_ = wpath._M_dataplus._M_p;
  std::filesystem::__cxx11::path::path<wchar_t_const*,std::filesystem::__cxx11::path>
            (&fspath,(wchar_t **)buf,auto_format);
  std::ifstream::ifstream(&is,fspath._M_pathname._M_dataplus._M_p,_S_in|_S_bin);
  if ((abStack_2210[*(long *)(_is + -0x18)] & 5) == 0) {
    std::filesystem::__cxx11::path::extension((path *)buf,&fspath);
    std::filesystem::__cxx11::path::string((string *)&date,(path *)buf);
    iVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)content_types_abi_cxx11_,(key_type *)&date);
    std::__cxx11::string::~string((string *)&date);
    std::filesystem::__cxx11::path::~path((path *)buf);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2418,"content-type",(allocator<char> *)buf);
      response_writer::set_header
                (resp,&local_2418,
                 (string *)
                 ((long)iVar3.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ._M_cur + 0x28));
      std::__cxx11::string::~string((string *)&local_2418);
    }
    __val = std::filesystem::file_size(&fspath);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2438,"content-length",(allocator<char> *)&date);
    std::__cxx11::to_string((string *)buf,__val);
    response_writer::set_header(resp,&local_2438,(string *)buf);
    std::__cxx11::string::~string((string *)buf);
    std::__cxx11::string::~string((string *)&local_2438);
    tp.__d.__r = (duration)std::filesystem::last_write_time(&fspath);
    tt = to_time_t<std::chrono::time_point<std::filesystem::__file_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                   (tp);
    __tp = gmtime(&tt);
    __lhs = (req->headers).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (req->headers).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (__lhs == ppVar1) goto LAB_001097e7;
      bVar2 = std::operator==(&__lhs->first,"If-Modified-Since");
      __lhs = __lhs + 1;
    } while (!bVar2);
    buf[0x20] = '\0';
    buf[0x21] = '\0';
    buf[0x22] = '\0';
    buf[0x23] = '\0';
    buf[0x24] = '\0';
    buf[0x25] = '\0';
    buf[0x26] = '\0';
    buf[0x27] = '\0';
    buf[0x28] = '\0';
    buf[0x29] = '\0';
    buf[0x2a] = '\0';
    buf[0x2b] = '\0';
    buf[0x2c] = '\0';
    buf[0x2d] = '\0';
    buf[0x2e] = '\0';
    buf[0x2f] = '\0';
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf[0x30] = '\0';
    buf[0x31] = '\0';
    buf[0x32] = '\0';
    buf[0x33] = '\0';
    buf[0x34] = '\0';
    buf[0x35] = '\0';
    buf[0x36] = '\0';
    buf[0x37] = '\0';
    tVar4 = mktime((tm *)buf);
    tVar5 = mktime(__tp);
    if (tVar5 < tVar4) {
LAB_001097e7:
      std::__cxx11::stringstream::stringstream((stringstream *)&date);
      __f._M_fmt = "%a, %d %B %Y %H:%M:%S GMT";
      __f._M_tmb = (tm *)__tp;
      std::operator<<(local_23a8,__f);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2478,"last-modified",&local_24aa);
      std::__cxx11::stringbuf::str();
      response_writer::set_header(resp,&local_2478,(string *)buf);
      std::__cxx11::string::~string((string *)buf);
      std::__cxx11::string::~string((string *)&local_2478);
      while ((abStack_2210[*(long *)(_is + -0x18)] & 2) == 0) {
        lVar6 = std::istream::read((char *)&is,(long)buf);
        (*resp->_vptr_response_writer[1])(resp,(string *)buf,*(undefined8 *)(lVar6 + 8));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&date);
      goto LAB_001098b2;
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&resp->headers);
    resp->code = 0x130;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2458,"content-type",&local_24aa);
    std::__cxx11::string::string<std::allocator<char>>((string *)&date,"text/plain",&local_24a9);
    response_writer::set_header(resp,&local_2458,(string *)&date);
    std::__cxx11::string::~string((string *)&date);
    std::__cxx11::string::~string((string *)&local_2458);
    std::__cxx11::string::string<std::allocator<char>>((string *)&date,"Not Modified",&local_24aa);
    (**resp->_vptr_response_writer)(resp,&date);
    this = (string *)&date;
  }
  else {
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&resp->headers);
    resp->code = 0x194;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_23f8,"content-type",(allocator<char> *)&date);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)buf,"text/plain",(allocator<char> *)&tt);
    response_writer::set_header(resp,&local_23f8,(string *)buf);
    std::__cxx11::string::~string((string *)buf);
    std::__cxx11::string::~string((string *)&local_23f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)buf,"Not Found",(allocator<char> *)&date);
    (**resp->_vptr_response_writer)(resp,buf);
    this = (string *)buf;
  }
  std::__cxx11::string::~string(this);
LAB_001098b2:
  std::ifstream::~ifstream(&is);
  std::filesystem::__cxx11::path::~path(&fspath);
  std::__cxx11::wstring::~wstring((wstring *)&wpath);
  return;
}

Assistant:

inline void serve_file(response_writer& resp, request& req, const std::string& path) {
  auto wpath = to_wstring(path);
  std::filesystem::path fspath(wpath.c_str());

  std::ifstream is(fspath, std::ios::in | std::ios::binary);
  if (is.fail()) {
    resp.clear_header();
    resp.code = 404;
    resp.set_header("content-type", "text/plain");
    resp.write("Not Found");
    return;
  }

  auto it = content_types.find(fspath.extension().string());
  if (it != content_types.end()) {
    resp.set_header("content-type", it->second);
  }

  std::uintmax_t size = std::filesystem::file_size(fspath);
  resp.set_header("content-length", std::to_string(size));

  std::filesystem::file_time_type file_time = std::filesystem::last_write_time(fspath);
  std::time_t tt = to_time_t(file_time);
  std::tm *gmt = std::gmtime(&tt);
  for (auto& h : req.headers) {
    if (h.first == "If-Modified-Since") {
      std::tm file_gmt{};
      (void) std::get_time(&file_gmt, h.second.c_str());
      if (std::mktime(&file_gmt) <= std::mktime(gmt)) {
        resp.clear_header();
        resp.code = 304;
        resp.set_header("content-type", "text/plain");
        resp.write("Not Modified");
        return;
      }
      break;
    }
  }

  std::stringstream date;
  date << std::put_time(gmt, "%a, %d %B %Y %H:%M:%S GMT");
  resp.set_header("last-modified", date.str());

  char buf[BUFSIZ];
  while (!is.eof()) {
    resp.write(buf, (size_t) is.read(buf, sizeof(buf)).gcount());
  }
}